

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O0

void __thiscall VectorDouble::storeValue(VectorDouble *this,double v,unsigned_long l)

{
  void *pvVar1;
  ulong in_RSI;
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  long addThis;
  long local_20;
  
  if ((ulong)in_RDI[2] <= in_RSI) {
    local_20 = (in_RSI - in_RDI[2]) + 1;
    if (local_20 < vDefaultBoost) {
      local_20 = vDefaultBoost;
    }
    in_RDI[2] = local_20 + in_RDI[2];
    pvVar1 = realloc((void *)*in_RDI,in_RDI[2] << 3);
    *in_RDI = (long)pvVar1;
    in_RDI[1] = in_RSI + 1;
  }
  *(undefined8 *)(*in_RDI + in_RSI * 8) = in_XMM0_Qa;
  return;
}

Assistant:

void VectorDouble::storeValue(const double v, const unsigned long l) {
  long addThis;
  if (l >= vaLength) {
    addThis = l - vaLength + 1;
    if (VectorDouble::vDefaultBoost > addThis)
      addThis = VectorDouble::vDefaultBoost;
    vaLength += addThis;
    vData = (double *)realloc(vData, sizeof(double) * vaLength);
    vLength = l + 1;
  }
  vData[l] = v;
}